

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O3

void std::__reverse<QList<QString>::iterator>(undefined8 *__first,undefined8 *__last)

{
  undefined8 uVar1;
  undefined8 *puVar2;
  
  puVar2 = __last + -3;
  if (__first < puVar2 && __first != __last) {
    do {
      uVar1 = *__first;
      *__first = *puVar2;
      *puVar2 = uVar1;
      uVar1 = __first[1];
      __first[1] = puVar2[1];
      puVar2[1] = uVar1;
      uVar1 = __first[2];
      __first[2] = puVar2[2];
      puVar2[2] = uVar1;
      __first = __first + 3;
      puVar2 = puVar2 + -3;
    } while (__first < puVar2);
  }
  return;
}

Assistant:

inline constexpr bool operator==(iterator o) const { return i == o.i; }